

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3WindowCompare(Parse *pParse,Window *p1,Window *p2,int bFilter)

{
  int iVar1;
  int iVar2;
  
  iVar2 = 1;
  if ((((((p2 != (Window *)0x0 && p1 != (Window *)0x0) && (p1->eFrmType == p2->eFrmType)) &&
        (p1->eStart == p2->eStart)) && ((p1->eEnd == p2->eEnd && (p1->eExclude == p2->eExclude))))
      && ((iVar1 = sqlite3ExprCompare(pParse,p1->pStart,p2->pStart,-1), iVar1 == 0 &&
          ((iVar1 = sqlite3ExprCompare(pParse,p1->pEnd,p2->pEnd,-1), iVar1 == 0 &&
           (iVar2 = sqlite3ExprListCompare(p1->pPartition,p2->pPartition,-1), iVar2 == 0)))))) &&
     ((iVar2 = sqlite3ExprListCompare(p1->pOrderBy,p2->pOrderBy,-1), iVar2 == 0 &&
      ((bFilter == 0 || (iVar2 = sqlite3ExprCompare(pParse,p1->pFilter,p2->pFilter,-1), iVar2 == 0))
      )))) {
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

SQLITE_PRIVATE int sqlite3WindowCompare(
  const Parse *pParse,
  const Window *p1,
  const Window *p2,
  int bFilter
){
  int res;
  if( NEVER(p1==0) || NEVER(p2==0) ) return 1;
  if( p1->eFrmType!=p2->eFrmType ) return 1;
  if( p1->eStart!=p2->eStart ) return 1;
  if( p1->eEnd!=p2->eEnd ) return 1;
  if( p1->eExclude!=p2->eExclude ) return 1;
  if( sqlite3ExprCompare(pParse, p1->pStart, p2->pStart, -1) ) return 1;
  if( sqlite3ExprCompare(pParse, p1->pEnd, p2->pEnd, -1) ) return 1;
  if( (res = sqlite3ExprListCompare(p1->pPartition, p2->pPartition, -1)) ){
    return res;
  }
  if( (res = sqlite3ExprListCompare(p1->pOrderBy, p2->pOrderBy, -1)) ){
    return res;
  }
  if( bFilter ){
    if( (res = sqlite3ExprCompare(pParse, p1->pFilter, p2->pFilter, -1)) ){
      return res;
    }
  }
  return 0;
}